

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O1

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp:365:52)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_global_object_cpp:365:52)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  gc_heap *h;
  bool bVar1;
  uint *puVar2;
  native_error_exception *this_00;
  global_object *this_01;
  pointer rhs;
  ulong uVar3;
  long lVar4;
  value val;
  wostringstream woss;
  wstring local_230;
  wstring_view local_210;
  wchar_t *local_200;
  size_t local_1f8;
  value local_1e0;
  wstring_view local_1b8;
  wostringstream local_1a8 [376];
  
  rhs = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
        super__Vector_impl_data._M_start;
  if (rhs == (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
             super__Vector_impl_data._M_finish) {
    rhs = (pointer)&value::undefined;
  }
  value::value(&local_1e0,rhs);
  bVar1 = to_boolean(&local_1e0);
  if (!bVar1) {
    std::__cxx11::wostringstream::wostringstream(local_1a8);
    if ((ulong)(((long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                       super__Vector_impl_data._M_start >> 3) * -0x3333333333333333) < 2) {
      debug_print((wostream *)local_1a8,&local_1e0,4,0x7fffffff,0);
      std::operator<<((wostream *)local_1a8," == true");
    }
    else {
      h = (this->f).global.super_gc_heap_ptr_untyped.heap_;
      uVar3 = 1;
      lVar4 = 0x28;
      do {
        if (1 < uVar3) {
          std::operator<<((wostream *)local_1a8," ");
        }
        to_string((mjs *)&local_230,h,
                  (value *)((long)&((args->
                                    super__Vector_base<mjs::value,_std::allocator<mjs::value>_>).
                                    _M_impl.super__Vector_impl_data._M_start)->type_ + lVar4));
        puVar2 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_230);
        std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                  ((wostream *)local_1a8,(wchar_t *)(puVar2 + 1),(ulong)*puVar2);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_230);
        uVar3 = uVar3 + 1;
        lVar4 = lVar4 + 0x28;
      } while (uVar3 < (ulong)(((long)(args->
                                      super__Vector_base<mjs::value,_std::allocator<mjs::value>_>).
                                      _M_impl.super__Vector_impl_data._M_finish -
                                (long)(args->
                                      super__Vector_base<mjs::value,_std::allocator<mjs::value>_>).
                                      _M_impl.super__Vector_impl_data._M_start >> 3) *
                              -0x3333333333333333));
    }
    this_00 = (native_error_exception *)__cxa_allocate_exception(0x58);
    this_01 = (global_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this->f);
    global_object::stack_trace_abi_cxx11_(&local_230,this_01);
    local_210._M_len = local_230._M_string_length;
    local_210._M_str = local_230._M_dataplus._M_p;
    std::__cxx11::wstringbuf::str();
    local_1b8._M_len = local_1f8;
    local_1b8._M_str = local_200;
    native_error_exception::native_error_exception(this_00,assertion,&local_210,&local_1b8);
    __cxa_throw(this_00,&native_error_exception::typeinfo,
                native_error_exception::~native_error_exception);
  }
  value::value(__return_storage_ptr__,(value *)&value::undefined);
  value::destroy(&local_1e0);
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }